

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::Range(BenchmarkImp *this,int start,int limit)

{
  bool bVar1;
  reference piVar2;
  int local_70;
  int local_6c;
  iterator iStack_68;
  int i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> arglist;
  CheckHandler local_20;
  int local_18;
  int local_14;
  int limit_local;
  int start_local;
  BenchmarkImp *this_local;
  
  bVar1 = false;
  local_18 = limit;
  local_14 = start;
  _limit_local = this;
  if ((this->arg_count_ == -1) || (this->arg_count_ == 1)) {
    GetNullLogInstance();
  }
  else {
    CheckHandler::CheckHandler
              (&local_20,"arg_count_ == -1 || arg_count_ == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"Range",0x1a7);
    bVar1 = true;
    CheckHandler::GetLog(&local_20);
  }
  if (!bVar1) {
    this->arg_count_ = 1;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range2);
    AddRange((vector<int,_std::allocator<int>_> *)&__range2,local_14,local_18,8);
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)&__range2);
    iStack_68 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff98);
      if (!bVar1) break;
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_6c = *piVar2;
      local_70 = -1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->args_,
                 &local_6c,&local_70);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range2);
    return;
  }
  CheckHandler::~CheckHandler(&local_20);
}

Assistant:

void BenchmarkImp::Range(int start, int limit) {
  CHECK(arg_count_ == -1 || arg_count_ == 1);
  arg_count_ = 1;
  std::vector<int> arglist;
  AddRange(&arglist, start, limit, kRangeMultiplier);

  for (int i : arglist) {
    args_.emplace_back(i, -1);
  }
}